

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O2

unsigned_long PaUtil_CopyInput(PaUtilBufferProcessor *bp,void **buffer,unsigned_long frameCount)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  PaUtilChannelDescriptor *pPVar7;
  void *pvVar8;
  
  if (bp->hostInputFrameCount[0] < frameCount) {
    frameCount = bp->hostInputFrameCount[0];
  }
  pPVar7 = bp->hostInputChannels[0];
  pvVar8 = *buffer;
  uVar5 = (uint)frameCount;
  if (bp->userInputIsInterleaved == 0) {
    for (uVar6 = 0; uVar6 < bp->inputChannelCount; uVar6 = uVar6 + 1) {
      pvVar3 = *(void **)((long)pvVar8 + uVar6 * 8);
      (*bp->inputConverter)(pvVar3,1,pPVar7->data,pPVar7->stride,uVar5,&bp->ditherGenerator);
      *(ulong *)((long)pvVar8 + uVar6 * 8) =
           (ulong)(bp->bytesPerUserInputSample * uVar5) + (long)pvVar3;
      pPVar7->data = (void *)((long)pPVar7->data +
                             (ulong)(pPVar7->stride * uVar5 * bp->bytesPerHostInputSample));
      pPVar7 = pPVar7 + 1;
    }
  }
  else {
    uVar1 = bp->inputChannelCount;
    uVar2 = bp->bytesPerUserInputSample;
    uVar4 = uVar1;
    for (uVar6 = 0; uVar6 < uVar4; uVar6 = uVar6 + 1) {
      (*bp->inputConverter)(pvVar8,uVar1,pPVar7->data,pPVar7->stride,uVar5,&bp->ditherGenerator);
      pPVar7->data = (void *)((long)pPVar7->data +
                             (ulong)(pPVar7->stride * uVar5 * bp->bytesPerHostInputSample));
      pvVar8 = (void *)((long)pvVar8 + (ulong)uVar2);
      uVar4 = bp->inputChannelCount;
      pPVar7 = pPVar7 + 1;
    }
    *buffer = (void *)((long)*buffer + (ulong)(uVar4 * uVar5 * bp->bytesPerUserInputSample));
  }
  bp->hostInputFrameCount[0] = bp->hostInputFrameCount[0] - (frameCount & 0xffffffff);
  return frameCount & 0xffffffff;
}

Assistant:

unsigned long PaUtil_CopyInput( PaUtilBufferProcessor* bp,
        void **buffer, unsigned long frameCount )
{
    PaUtilChannelDescriptor *hostInputChannels;
    unsigned int framesToCopy;
    unsigned char *destBytePtr;
    void **nonInterleavedDestPtrs;
    unsigned int destSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int destChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int i;

    hostInputChannels = bp->hostInputChannels[0];
    framesToCopy = PA_MIN_( bp->hostInputFrameCount[0], frameCount );

    if( bp->userInputIsInterleaved )
    {
        destBytePtr = (unsigned char*)*buffer;
        
        destSampleStrideSamples = bp->inputChannelCount;
        destChannelStrideBytes = bp->bytesPerUserInputSample;

        for( i=0; i<bp->inputChannelCount; ++i )
        {
            bp->inputConverter( destBytePtr, destSampleStrideSamples,
                                hostInputChannels[i].data,
                                hostInputChannels[i].stride,
                                framesToCopy, &bp->ditherGenerator );

            destBytePtr += destChannelStrideBytes;  /* skip to next dest channel */

            /* advance source ptr for next iteration */
            hostInputChannels[i].data = ((unsigned char*)hostInputChannels[i].data) +
                    framesToCopy * hostInputChannels[i].stride * bp->bytesPerHostInputSample;
        }

        /* advance callers dest pointer (buffer) */
        *buffer = ((unsigned char *)*buffer) +
                framesToCopy * bp->inputChannelCount * bp->bytesPerUserInputSample;
    }
    else
    {
        /* user input is not interleaved */
        
        nonInterleavedDestPtrs = (void**)*buffer;

        destSampleStrideSamples = 1;
        
        for( i=0; i<bp->inputChannelCount; ++i )
        {
            destBytePtr = (unsigned char*)nonInterleavedDestPtrs[i];

            bp->inputConverter( destBytePtr, destSampleStrideSamples,
                                hostInputChannels[i].data,
                                hostInputChannels[i].stride,
                                framesToCopy, &bp->ditherGenerator );

            /* advance callers dest pointer (nonInterleavedDestPtrs[i]) */
            destBytePtr += bp->bytesPerUserInputSample * framesToCopy;
            nonInterleavedDestPtrs[i] = destBytePtr;
            
            /* advance source ptr for next iteration */
            hostInputChannels[i].data = ((unsigned char*)hostInputChannels[i].data) +
                    framesToCopy * hostInputChannels[i].stride * bp->bytesPerHostInputSample;
        }
    }

    bp->hostInputFrameCount[0] -= framesToCopy;
    
    return framesToCopy;
}